

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

void js_std_free_handlers(JSRuntime *rt)

{
  JSOSRWHandler *pJVar1;
  JSOSSignalHandler *pJVar2;
  JSOSTimer *pJVar3;
  list_head *plVar4;
  list_head *prev;
  JSOSRWHandler *__ptr;
  JSOSRWHandler *rh;
  JSOSSignalHandler *sh;
  list_head *next;
  JSOSTimer *th;
  
  __ptr = (JSOSRWHandler *)JS_GetRuntimeOpaque(rt);
  rh = (JSOSRWHandler *)(__ptr->link).next;
  while (rh != __ptr) {
    pJVar1 = (JSOSRWHandler *)(rh->link).next;
    free_rw_handler(rt,rh);
    rh = pJVar1;
  }
  sh = (JSOSSignalHandler *)__ptr->rw_func[0].u.ptr;
  while (sh != (JSOSSignalHandler *)&__ptr->fd) {
    pJVar2 = (JSOSSignalHandler *)(sh->link).next;
    free_sh(rt,sh);
    sh = pJVar2;
  }
  pJVar3 = (JSOSTimer *)__ptr->rw_func[1].u.ptr;
  while (th = pJVar3, th != (JSOSTimer *)&__ptr->rw_func[0].tag) {
    pJVar3 = (JSOSTimer *)(th->link).next;
    plVar4 = (th->link).prev;
    if (plVar4 != (list_head *)0x0) {
      plVar4->next = (list_head *)pJVar3;
      (pJVar3->link).prev = plVar4;
      (th->link).prev = (list_head *)0x0;
      (th->link).next = (list_head *)0x0;
    }
    if (th->has_object == 0) {
      free_timer(rt,th);
    }
  }
  js_free_message_pipe(*(JSWorkerMessagePipe **)&__ptr[1].fd);
  js_free_message_pipe((JSWorkerMessagePipe *)__ptr[1].rw_func[0].u.ptr);
  free(__ptr);
  JS_SetRuntimeOpaque(rt,(void *)0x0);
  return;
}

Assistant:

void js_std_free_handlers(JSRuntime *rt)
{
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    struct list_head *el, *el1;

    list_for_each_safe(el, el1, &ts->os_rw_handlers) {
        JSOSRWHandler *rh = list_entry(el, JSOSRWHandler, link);
        free_rw_handler(rt, rh);
    }

    list_for_each_safe(el, el1, &ts->os_signal_handlers) {
        JSOSSignalHandler *sh = list_entry(el, JSOSSignalHandler, link);
        free_sh(rt, sh);
    }
    
    list_for_each_safe(el, el1, &ts->os_timers) {
        JSOSTimer *th = list_entry(el, JSOSTimer, link);
        unlink_timer(rt, th);
        if (!th->has_object)
            free_timer(rt, th);
    }

#ifdef USE_WORKER
    /* XXX: free port_list ? */
    js_free_message_pipe(ts->recv_pipe);
    js_free_message_pipe(ts->send_pipe);
#endif

    free(ts);
    JS_SetRuntimeOpaque(rt, NULL); /* fail safe */
}